

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O0

int localLog(mpt_logger *log,char *from,int type,char *fmt,__va_list_tag *arg)

{
  undefined8 *puVar1;
  mpt_local_output *lo;
  __va_list_tag *arg_local;
  char *fmt_local;
  int type_local;
  char *from_local;
  mpt_logger *log_local;
  
  if (((ulong)log[4]._vptr & 0x10) == 0) {
    log_local._4_4_ = mpt_logfile_log(log + 3,from,type,fmt,arg);
  }
  else {
    puVar1 = (undefined8 *)mpt_log_default();
    if (puVar1 == (undefined8 *)0x0) {
      log_local._4_4_ = 0;
    }
    else {
      log_local._4_4_ = (**(code **)*puVar1)(puVar1,from,type,fmt,arg);
    }
  }
  return log_local._4_4_;
}

Assistant:

static int localLog(MPT_INTERFACE(logger) *log, const char *from, int type, const char *fmt, va_list arg)
{
	MPT_STRUCT(local_output) *lo = MPT_baseaddr(local_output, log, _log);
	
	if (!(lo->hist.info.state & MPT_OUTFLAG(Active))) {
		return mpt_logfile_log(&lo->hist.info, from, type, fmt, arg);
	}
	if ((log = mpt_log_default())) {
		return log->_vptr->log(log, from, type, fmt, arg);
	}
	return 0;
}